

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::MergeCacheTest::createInstance(MergeCacheTest *this,Context *context)

{
  MergeCacheTestInstance *this_00;
  Context *context_local;
  MergeCacheTest *this_local;
  
  this_00 = (MergeCacheTestInstance *)operator_new(0x5d8);
  MergeCacheTestInstance::MergeCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* MergeCacheTest::createInstance (Context& context) const
{
	return new MergeCacheTestInstance(context, &m_param);
}